

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O0

void __thiscall
booster::locale::localization_backend_manager::impl::actual_backend::actual_backend
          (actual_backend *this,
          vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
          *backends,vector<int,_std::allocator<int>_> *index)

{
  int iVar1;
  __shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  localization_backend *in_RDI;
  uint i;
  localization_backend *__new_size;
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  *this_01;
  uint local_28;
  
  localization_backend::localization_backend(in_RDI);
  in_RDI->_vptr_localization_backend = (_func_int **)&PTR__actual_backend_002e95f0;
  this_01 = (vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
             *)(in_RDI + 1);
  std::
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ::vector((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
            *)0x23cb23);
  std::vector<int,_std::allocator<int>_>::vector(in_RSI,in_RDX);
  __new_size = in_RDI + 1;
  std::
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ::size((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
          *)in_RSI);
  std::
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ::resize(this_01,(size_type)__new_size);
  local_28 = 0;
  while( true ) {
    this_00 = (__shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2> *)
              (ulong)local_28;
    p_Var2 = (__shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2> *)
             std::
             vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
             ::size((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                     *)in_RSI);
    if (p_Var2 <= this_00) break;
    std::
    vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
    ::operator[]((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                  *)(in_RDI + 1),(ulong)local_28);
    std::
    vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
    ::operator[]((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                  *)in_RSI,(ulong)local_28);
    peVar3 = std::
             __shared_ptr_access<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x23cbc1);
    iVar1 = (*peVar3->_vptr_localization_backend[2])();
    std::__shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>::
    reset<booster::locale::localization_backend>
              (this_00,(localization_backend *)CONCAT44(extraout_var,iVar1));
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

actual_backend(std::vector<booster::shared_ptr<localization_backend> > const &backends,std::vector<int> const &index):
                    index_(index)
                {
                    backends_.resize(backends.size());
                    for(unsigned i=0;i<backends.size();i++) {
                        backends_[i].reset(backends[i]->clone());
                    }
                }